

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool detect_stuff(effect_handler_context_t_conflict *context,_func__Bool_object_ptr *pred)

{
  _Bool _Var1;
  _Bool _Var2;
  loc_conflict grid_00;
  object *local_48;
  object *obj;
  loc_conflict grid;
  wchar_t wStack_2c;
  _Bool have_stuff;
  wchar_t y2;
  wchar_t y1;
  wchar_t x2;
  wchar_t x1;
  wchar_t y;
  wchar_t x;
  _func__Bool_object_ptr *pred_local;
  effect_handler_context_t_conflict *context_local;
  
  _Var1 = false;
  wStack_2c = (player->grid).y - context->y;
  grid.y = (player->grid).y + context->y;
  y1 = (player->grid).x - context->x;
  y2 = (player->grid).x + context->x;
  if (wStack_2c < L'\0') {
    wStack_2c = L'\0';
  }
  if (y1 < L'\0') {
    y1 = L'\0';
  }
  if (cave->height + L'\xffffffff' < grid.y) {
    grid.y = cave->height + L'\xffffffff';
  }
  if (cave->width + L'\xffffffff' < y2) {
    y2 = cave->width + L'\xffffffff';
  }
  for (x2 = wStack_2c; x2 <= grid.y; x2 = x2 + L'\x01') {
    for (x1 = y1; x1 <= y2; x1 = x1 + L'\x01') {
      grid_00 = (loc_conflict)loc(x1,x2);
      for (local_48 = square_object((chunk *)cave,grid_00);
          _Var1 == false && local_48 != (object *)0x0; local_48 = local_48->next) {
        _Var2 = (*pred)(local_48);
        if ((_Var2) && (_Var2 = ignore_item_ok(player,local_48), !_Var2)) {
          _Var1 = true;
        }
      }
      square_know_pile((chunk *)cave,grid_00,pred);
    }
  }
  return _Var1;
}

Assistant:

static bool detect_stuff(effect_handler_context_t *context,
		bool (*pred)(const struct object*))
{
	int x, y;
	int x1, x2, y1, y2;

	bool have_stuff = false;

	/* Pick an area to detect */
	y1 = player->grid.y - context->y;
	y2 = player->grid.y + context->y;
	x1 = player->grid.x - context->x;
	x2 = player->grid.x + context->x;

	if (y1 < 0) y1 = 0;
	if (x1 < 0) x1 = 0;
	if (y2 > cave->height - 1) y2 = cave->height - 1;
	if (x2 > cave->width - 1) x2 = cave->width - 1;

	/* Scan the area */
	for (y = y1; y <= y2; y++) {
		for (x = x1; x <= x2; x++) {
			struct loc grid = loc(x, y);
			struct object *obj = square_object(cave, grid);

			/*
			 * Is there any object matching the predicate which is
			 * not ignored?
			 */
			for (; !have_stuff && obj; obj = obj->next) {
				if ((*pred)(obj) && !ignore_item_ok(player, obj)) {
					have_stuff = true;
				}
			}

			/*
			 * Mark the parts of the pile that match the predicate
			 * as seen.  Forget remembered parts that match the
			 * predicate which are no longer there.
			 */
			square_know_pile(cave, grid, pred);
		}
	}

	return have_stuff;
}